

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftFvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  pointer pnVar1;
  pointer pnVar2;
  double dVar3;
  double dVar4;
  type_conflict5 tVar5;
  bool bVar6;
  long lVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  uint i;
  byte bVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<200U,_int,_void> local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  allow;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxrandom;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_138;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minrandom;
  
  bVar11 = 0;
  allow.m_backend.data._M_elems[0] = 0;
  allow.m_backend.data._M_elems[1] = 0x40240000;
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&maxrandom.m_backend,this);
  minrandom.m_backend.fpclass = cpp_dec_float_finite;
  minrandom.m_backend.prec_elem = 0x1c;
  minrandom.m_backend.data._M_elems[0] = 0;
  minrandom.m_backend.data._M_elems[1] = 0;
  minrandom.m_backend.data._M_elems[2] = 0;
  minrandom.m_backend.data._M_elems[3] = 0;
  minrandom.m_backend.data._M_elems[4] = 0;
  minrandom.m_backend.data._M_elems[5] = 0;
  minrandom.m_backend.data._M_elems[6] = 0;
  minrandom.m_backend.data._M_elems[7] = 0;
  minrandom.m_backend.data._M_elems[8] = 0;
  minrandom.m_backend.data._M_elems[9] = 0;
  minrandom.m_backend.data._M_elems[10] = 0;
  minrandom.m_backend.data._M_elems[0xb] = 0;
  minrandom.m_backend.data._M_elems[0xc] = 0;
  minrandom.m_backend.data._M_elems[0xd] = 0;
  minrandom.m_backend.data._M_elems[0xe] = 0;
  minrandom.m_backend.data._M_elems[0xf] = 0;
  minrandom.m_backend.data._M_elems[0x10] = 0;
  minrandom.m_backend.data._M_elems[0x11] = 0;
  minrandom.m_backend.data._M_elems[0x12] = 0;
  minrandom.m_backend.data._M_elems[0x13] = 0;
  minrandom.m_backend.data._M_elems[0x14] = 0;
  minrandom.m_backend.data._M_elems[0x15] = 0;
  minrandom.m_backend.data._M_elems[0x16] = 0;
  minrandom.m_backend.data._M_elems[0x17] = 0;
  minrandom.m_backend.data._M_elems[0x18] = 0;
  minrandom.m_backend.data._M_elems[0x19] = 0;
  minrandom.m_backend.data._M_elems._104_5_ = 0;
  minrandom.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  minrandom.m_backend.exp = 0;
  minrandom.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&minrandom.m_backend,&maxrandom.m_backend,(double *)&allow);
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0x40590000;
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&allow.m_backend,this);
  maxrandom.m_backend.fpclass = cpp_dec_float_finite;
  maxrandom.m_backend.prec_elem = 0x1c;
  maxrandom.m_backend.data._M_elems[0] = 0;
  maxrandom.m_backend.data._M_elems[1] = 0;
  maxrandom.m_backend.data._M_elems[2] = 0;
  maxrandom.m_backend.data._M_elems[3] = 0;
  maxrandom.m_backend.data._M_elems[4] = 0;
  maxrandom.m_backend.data._M_elems[5] = 0;
  maxrandom.m_backend.data._M_elems[6] = 0;
  maxrandom.m_backend.data._M_elems[7] = 0;
  maxrandom.m_backend.data._M_elems[8] = 0;
  maxrandom.m_backend.data._M_elems[9] = 0;
  maxrandom.m_backend.data._M_elems[10] = 0;
  maxrandom.m_backend.data._M_elems[0xb] = 0;
  maxrandom.m_backend.data._M_elems[0xc] = 0;
  maxrandom.m_backend.data._M_elems[0xd] = 0;
  maxrandom.m_backend.data._M_elems[0xe] = 0;
  maxrandom.m_backend.data._M_elems[0xf] = 0;
  maxrandom.m_backend.data._M_elems[0x10] = 0;
  maxrandom.m_backend.data._M_elems[0x11] = 0;
  maxrandom.m_backend.data._M_elems[0x12] = 0;
  maxrandom.m_backend.data._M_elems[0x13] = 0;
  maxrandom.m_backend.data._M_elems[0x14] = 0;
  maxrandom.m_backend.data._M_elems[0x15] = 0;
  maxrandom.m_backend.data._M_elems[0x16] = 0;
  maxrandom.m_backend.data._M_elems[0x17] = 0;
  maxrandom.m_backend.data._M_elems[0x18] = 0;
  maxrandom.m_backend.data._M_elems[0x19] = 0;
  maxrandom.m_backend.data._M_elems._104_5_ = 0;
  maxrandom.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  maxrandom.m_backend.exp = 0;
  maxrandom.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&maxrandom.m_backend,&allow.m_backend,(double *)&result_2);
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&result_2.m_backend,this);
  epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&result_3.m_backend,this);
  allow.m_backend.fpclass = cpp_dec_float_finite;
  allow.m_backend.prec_elem = 0x1c;
  allow.m_backend.data._M_elems[0] = 0;
  allow.m_backend.data._M_elems[1] = 0;
  allow.m_backend.data._M_elems[2] = 0;
  allow.m_backend.data._M_elems[3] = 0;
  allow.m_backend.data._M_elems[4] = 0;
  allow.m_backend.data._M_elems[5] = 0;
  allow.m_backend.data._M_elems[6] = 0;
  allow.m_backend.data._M_elems[7] = 0;
  allow.m_backend.data._M_elems[8] = 0;
  allow.m_backend.data._M_elems[9] = 0;
  allow.m_backend.data._M_elems[10] = 0;
  allow.m_backend.data._M_elems[0xb] = 0;
  allow.m_backend.data._M_elems[0xc] = 0;
  allow.m_backend.data._M_elems[0xd] = 0;
  allow.m_backend.data._M_elems[0xe] = 0;
  allow.m_backend.data._M_elems[0xf] = 0;
  allow.m_backend.data._M_elems[0x10] = 0;
  allow.m_backend.data._M_elems[0x11] = 0;
  allow.m_backend.data._M_elems[0x12] = 0;
  allow.m_backend.data._M_elems[0x13] = 0;
  allow.m_backend.data._M_elems[0x14] = 0;
  allow.m_backend.data._M_elems[0x15] = 0;
  allow.m_backend.data._M_elems[0x16] = 0;
  allow.m_backend.data._M_elems[0x17] = 0;
  allow.m_backend.data._M_elems[0x18] = 0;
  allow.m_backend.data._M_elems[0x19] = 0;
  allow.m_backend.data._M_elems._104_5_ = 0;
  allow.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  allow.m_backend.exp = 0;
  allow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&allow.m_backend,&result_2.m_backend,&result_3.m_backend);
  i = (this->thecovectors->set).thenum;
LAB_003e130d:
  while( true ) {
    if ((int)i < 1) {
      return;
    }
    i = i - 1;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems[0xe] = 0;
    result_2.m_backend.data._M_elems[0xf] = 0;
    result_2.m_backend.data._M_elems[0x10] = 0;
    result_2.m_backend.data._M_elems[0x11] = 0;
    result_2.m_backend.data._M_elems[0x12] = 0;
    result_2.m_backend.data._M_elems[0x13] = 0;
    result_2.m_backend.data._M_elems[0x14] = 0;
    result_2.m_backend.data._M_elems[0x15] = 0;
    result_2.m_backend.data._M_elems[0x16] = 0;
    result_2.m_backend.data._M_elems[0x17] = 0;
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_2.m_backend,
               &(this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&allow.m_backend);
    tVar5 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_2.m_backend,
                       (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    if (!tVar5) goto LAB_003e1539;
    result_3.m_backend.fpclass = cpp_dec_float_finite;
    result_3.m_backend.prec_elem = 0x1c;
    result_3.m_backend.data._M_elems[0] = 0;
    result_3.m_backend.data._M_elems[1] = 0;
    result_3.m_backend.data._M_elems[2] = 0;
    result_3.m_backend.data._M_elems[3] = 0;
    result_3.m_backend.data._M_elems[4] = 0;
    result_3.m_backend.data._M_elems[5] = 0;
    result_3.m_backend.data._M_elems[6] = 0;
    result_3.m_backend.data._M_elems[7] = 0;
    result_3.m_backend.data._M_elems[8] = 0;
    result_3.m_backend.data._M_elems[9] = 0;
    result_3.m_backend.data._M_elems[10] = 0;
    result_3.m_backend.data._M_elems[0xb] = 0;
    result_3.m_backend.data._M_elems[0xc] = 0;
    result_3.m_backend.data._M_elems[0xd] = 0;
    result_3.m_backend.data._M_elems[0xe] = 0;
    result_3.m_backend.data._M_elems[0xf] = 0;
    result_3.m_backend.data._M_elems[0x10] = 0;
    result_3.m_backend.data._M_elems[0x11] = 0;
    result_3.m_backend.data._M_elems[0x12] = 0;
    result_3.m_backend.data._M_elems[0x13] = 0;
    result_3.m_backend.data._M_elems[0x14] = 0;
    result_3.m_backend.data._M_elems[0x15] = 0;
    result_3.m_backend.data._M_elems[0x16] = 0;
    result_3.m_backend.data._M_elems[0x17] = 0;
    result_3.m_backend.data._M_elems[0x18] = 0;
    result_3.m_backend.data._M_elems[0x19] = 0;
    result_3.m_backend.data._M_elems._104_5_ = 0;
    result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_3.m_backend.exp = 0;
    result_3.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_3.m_backend,
               &(this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems[0xe] = 0;
    result_2.m_backend.data._M_elems[0xf] = 0;
    result_2.m_backend.data._M_elems[0x10] = 0;
    result_2.m_backend.data._M_elems[0x11] = 0;
    result_2.m_backend.data._M_elems[0x12] = 0;
    result_2.m_backend.data._M_elems[0x13] = 0;
    result_2.m_backend.data._M_elems[0x14] = 0;
    result_2.m_backend.data._M_elems[0x15] = 0;
    result_2.m_backend.data._M_elems[0x16] = 0;
    result_2.m_backend.data._M_elems[0x17] = 0;
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_2.m_backend,&result_3.m_backend,&allow.m_backend);
    bVar6 = boost::multiprecision::operator!=
                      ((this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i,
                       (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    pcVar8 = &(this->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    if (!bVar6) break;
    dVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&minrandom.m_backend);
    dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&maxrandom.m_backend);
    result_2.m_backend.data._M_elems._0_8_ = Random::next(&this->random,dVar3,dVar4);
    result_5.m_backend.fpclass = cpp_dec_float_finite;
    result_5.m_backend.prec_elem = 0x1c;
    result_5.m_backend.data._M_elems[0] = 0;
    result_5.m_backend.data._M_elems[1] = 0;
    result_5.m_backend.data._M_elems[2] = 0;
    result_5.m_backend.data._M_elems[3] = 0;
    result_5.m_backend.data._M_elems[4] = 0;
    result_5.m_backend.data._M_elems[5] = 0;
    result_5.m_backend.data._M_elems[6] = 0;
    result_5.m_backend.data._M_elems[7] = 0;
    result_5.m_backend.data._M_elems[8] = 0;
    result_5.m_backend.data._M_elems[9] = 0;
    result_5.m_backend.data._M_elems[10] = 0;
    result_5.m_backend.data._M_elems[0xb] = 0;
    result_5.m_backend.data._M_elems[0xc] = 0;
    result_5.m_backend.data._M_elems[0xd] = 0;
    result_5.m_backend.data._M_elems[0xe] = 0;
    result_5.m_backend.data._M_elems[0xf] = 0;
    result_5.m_backend.data._M_elems[0x10] = 0;
    result_5.m_backend.data._M_elems[0x11] = 0;
    result_5.m_backend.data._M_elems[0x12] = 0;
    result_5.m_backend.data._M_elems[0x13] = 0;
    result_5.m_backend.data._M_elems[0x14] = 0;
    result_5.m_backend.data._M_elems[0x15] = 0;
    result_5.m_backend.data._M_elems[0x16] = 0;
    result_5.m_backend.data._M_elems[0x17] = 0;
    result_5.m_backend.data._M_elems[0x18] = 0;
    result_5.m_backend.data._M_elems[0x19] = 0;
    result_5.m_backend.data._M_elems._104_5_ = 0;
    result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_5.m_backend.exp = 0;
    result_5.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&result_5.m_backend,pcVar8,(double *)&result_2);
    shiftUBbound(this,i,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result_5.m_backend);
  }
  pcVar9 = pcVar8;
  pnVar10 = &local_138;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
    pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + ((ulong)bVar11 * -2 + 1) * 4);
  }
  local_138.m_backend.exp = pcVar8->exp;
  local_138.m_backend.neg = pcVar8->neg;
  local_138.m_backend.fpclass = pcVar8->fpclass;
  local_138.m_backend.prec_elem = pcVar8->prec_elem;
  shiftUBbound(this,i,&local_138);
  pnVar1 = (this->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar2 = (this->theLBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  goto LAB_003e17f3;
LAB_003e1539:
  pnVar1 = (this->theFvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 0x1c;
  result_2.m_backend.data._M_elems[0] = 0;
  result_2.m_backend.data._M_elems[1] = 0;
  result_2.m_backend.data._M_elems[2] = 0;
  result_2.m_backend.data._M_elems[3] = 0;
  result_2.m_backend.data._M_elems[4] = 0;
  result_2.m_backend.data._M_elems[5] = 0;
  result_2.m_backend.data._M_elems[6] = 0;
  result_2.m_backend.data._M_elems[7] = 0;
  result_2.m_backend.data._M_elems[8] = 0;
  result_2.m_backend.data._M_elems[9] = 0;
  result_2.m_backend.data._M_elems[10] = 0;
  result_2.m_backend.data._M_elems[0xb] = 0;
  result_2.m_backend.data._M_elems[0xc] = 0;
  result_2.m_backend.data._M_elems[0xd] = 0;
  result_2.m_backend.data._M_elems[0xe] = 0;
  result_2.m_backend.data._M_elems[0xf] = 0;
  result_2.m_backend.data._M_elems[0x10] = 0;
  result_2.m_backend.data._M_elems[0x11] = 0;
  result_2.m_backend.data._M_elems[0x12] = 0;
  result_2.m_backend.data._M_elems[0x13] = 0;
  result_2.m_backend.data._M_elems[0x14] = 0;
  result_2.m_backend.data._M_elems[0x15] = 0;
  result_2.m_backend.data._M_elems[0x16] = 0;
  result_2.m_backend.data._M_elems[0x17] = 0;
  result_2.m_backend.data._M_elems[0x18] = 0;
  result_2.m_backend.data._M_elems[0x19] = 0;
  result_2.m_backend.data._M_elems._104_5_ = 0;
  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_2.m_backend.exp = 0;
  result_2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_2.m_backend,
             &(this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&allow.m_backend);
  tVar5 = boost::multiprecision::operator<
                    (pnVar1 + i,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result_2.m_backend);
  if (tVar5) {
    result_3.m_backend.fpclass = cpp_dec_float_finite;
    result_3.m_backend.prec_elem = 0x1c;
    result_3.m_backend.data._M_elems[0] = 0;
    result_3.m_backend.data._M_elems[1] = 0;
    result_3.m_backend.data._M_elems[2] = 0;
    result_3.m_backend.data._M_elems[3] = 0;
    result_3.m_backend.data._M_elems[4] = 0;
    result_3.m_backend.data._M_elems[5] = 0;
    result_3.m_backend.data._M_elems[6] = 0;
    result_3.m_backend.data._M_elems[7] = 0;
    result_3.m_backend.data._M_elems[8] = 0;
    result_3.m_backend.data._M_elems[9] = 0;
    result_3.m_backend.data._M_elems[10] = 0;
    result_3.m_backend.data._M_elems[0xb] = 0;
    result_3.m_backend.data._M_elems[0xc] = 0;
    result_3.m_backend.data._M_elems[0xd] = 0;
    result_3.m_backend.data._M_elems[0xe] = 0;
    result_3.m_backend.data._M_elems[0xf] = 0;
    result_3.m_backend.data._M_elems[0x10] = 0;
    result_3.m_backend.data._M_elems[0x11] = 0;
    result_3.m_backend.data._M_elems[0x12] = 0;
    result_3.m_backend.data._M_elems[0x13] = 0;
    result_3.m_backend.data._M_elems[0x14] = 0;
    result_3.m_backend.data._M_elems[0x15] = 0;
    result_3.m_backend.data._M_elems[0x16] = 0;
    result_3.m_backend.data._M_elems[0x17] = 0;
    result_3.m_backend.data._M_elems[0x18] = 0;
    result_3.m_backend.data._M_elems[0x19] = 0;
    result_3.m_backend.data._M_elems._104_5_ = 0;
    result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_3.m_backend.exp = 0;
    result_3.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_3.m_backend,
               &(this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems[0xe] = 0;
    result_2.m_backend.data._M_elems[0xf] = 0;
    result_2.m_backend.data._M_elems[0x10] = 0;
    result_2.m_backend.data._M_elems[0x11] = 0;
    result_2.m_backend.data._M_elems[0x12] = 0;
    result_2.m_backend.data._M_elems[0x13] = 0;
    result_2.m_backend.data._M_elems[0x14] = 0;
    result_2.m_backend.data._M_elems[0x15] = 0;
    result_2.m_backend.data._M_elems[0x16] = 0;
    result_2.m_backend.data._M_elems[0x17] = 0;
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_2.m_backend,&result_3.m_backend,&allow.m_backend);
    bVar6 = boost::multiprecision::operator!=
                      ((this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i,
                       (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    pcVar8 = &(this->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    if (bVar6) {
      dVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                        (&minrandom.m_backend);
      dVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                        (&maxrandom.m_backend);
      result_2.m_backend.data._M_elems._0_8_ = Random::next(&this->random,dVar3,dVar4);
      local_3b8.fpclass = cpp_dec_float_finite;
      local_3b8.prec_elem = 0x1c;
      local_3b8.data._M_elems[0] = 0;
      local_3b8.data._M_elems[1] = 0;
      local_3b8.data._M_elems[2] = 0;
      local_3b8.data._M_elems[3] = 0;
      local_3b8.data._M_elems[4] = 0;
      local_3b8.data._M_elems[5] = 0;
      local_3b8.data._M_elems[6] = 0;
      local_3b8.data._M_elems[7] = 0;
      local_3b8.data._M_elems[8] = 0;
      local_3b8.data._M_elems[9] = 0;
      local_3b8.data._M_elems[10] = 0;
      local_3b8.data._M_elems[0xb] = 0;
      local_3b8.data._M_elems[0xc] = 0;
      local_3b8.data._M_elems[0xd] = 0;
      local_3b8.data._M_elems[0xe] = 0;
      local_3b8.data._M_elems[0xf] = 0;
      local_3b8.data._M_elems[0x10] = 0;
      local_3b8.data._M_elems[0x11] = 0;
      local_3b8.data._M_elems[0x12] = 0;
      local_3b8.data._M_elems[0x13] = 0;
      local_3b8.data._M_elems[0x14] = 0;
      local_3b8.data._M_elems[0x15] = 0;
      local_3b8.data._M_elems[0x16] = 0;
      local_3b8.data._M_elems[0x17] = 0;
      local_3b8.data._M_elems[0x18] = 0;
      local_3b8.data._M_elems[0x19] = 0;
      local_3b8.data._M_elems._104_5_ = 0;
      local_3b8.data._M_elems[0x1b]._1_3_ = 0;
      local_3b8.exp = 0;
      local_3b8.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&local_3b8,pcVar8,(double *)&result_2.m_backend);
      shiftLBbound(this,i,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_3b8);
    }
    else {
      pcVar9 = pcVar8;
      pnVar10 = &local_1b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar11 * -8 + 4);
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar11 * -2 + 1) * 4);
      }
      local_1b8.m_backend.exp = pcVar8->exp;
      local_1b8.m_backend.neg = pcVar8->neg;
      local_1b8.m_backend.fpclass = pcVar8->fpclass;
      local_1b8.m_backend.prec_elem = pcVar8->prec_elem;
      shiftLBbound(this,i,&local_1b8);
      pnVar1 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar2 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
LAB_003e17f3:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&pnVar2[i].m_backend,&pnVar1[i].m_backend);
    }
  }
  goto LAB_003e130d;
}

Assistant:

void SPxSolverBase<R>::shiftFvec()
{

   /* the allowed tolerance is (rep() == COLUMN) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because theFvec is the primal VectorBase<R> in COLUMN
    * and the dual VectorBase<R> in ROW representation; this is equivalent to entertol()
    */
   R minrandom = 10.0 * entertol();
   R maxrandom = 100.0 * entertol();
   R allow = entertol() - epsilon();

   assert(type() == ENTER);
   assert(allow > 0);

   for(int i = dim() - 1; i >= 0; --i)
   {
      if(theUBbound[i] + allow < (*theFvec)[i])
      {
         SPxOut::debug(this, "DSHIFT08 theUBbound[{}] violated by {}", i,
                       (*theFvec)[i] - theUBbound[i] - allow);

         if(theUBbound[i] != theLBbound[i])
         {
            // since minrandom and maxrandom are of the order 10 different,
            // we currently doesn't care about higher precision random
            // numbers. Hence the cast to double.
            shiftUBbound(i, (*theFvec)[i] + random.next((double)minrandom, (double)maxrandom));
         }
         else
         {
            shiftUBbound(i, (*theFvec)[i]);
            theLBbound[i] = theUBbound[i];
         }
      }
      else if((*theFvec)[i] < theLBbound[i] - allow)
      {
         SPxOut::debug(this, "DSHIFT08 theLBbound[{}] violated by {}", i,
                       theLBbound[i] - (*theFvec)[i] - allow);

         if(theUBbound[i] != theLBbound[i])
            shiftLBbound(i, (*theFvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLBbound(i, (*theFvec)[i]);
            theUBbound[i] = theLBbound[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT01 shiftFvec: OK\n");
#endif
}